

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void __thiscall Fossilize::StateReplayer::Impl::copy_handle_references(Impl *this,Impl *other)

{
  Impl *other_local;
  Impl *this_local;
  
  std::
  unordered_map<unsigned_long,_VkSampler_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>_>
  ::operator=(&this->replayed_samplers,&other->replayed_samplers);
  std::
  unordered_map<unsigned_long,_VkDescriptorSetLayout_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>_>
  ::operator=(&this->replayed_descriptor_set_layouts,&other->replayed_descriptor_set_layouts);
  std::
  unordered_map<unsigned_long,_VkPipelineLayout_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>_>
  ::operator=(&this->replayed_pipeline_layouts,&other->replayed_pipeline_layouts);
  std::
  unordered_map<unsigned_long,_VkShaderModule_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>_>
  ::operator=(&this->replayed_shader_modules,&other->replayed_shader_modules);
  std::
  unordered_map<unsigned_long,_VkRenderPass_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>_>
  ::operator=(&this->replayed_render_passes,&other->replayed_render_passes);
  std::
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  ::operator=(&this->replayed_compute_pipelines,&other->replayed_compute_pipelines);
  std::
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  ::operator=(&this->replayed_graphics_pipelines,&other->replayed_graphics_pipelines);
  std::
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  ::operator=(&this->replayed_raytracing_pipelines,&other->replayed_raytracing_pipelines);
  return;
}

Assistant:

void StateReplayer::Impl::copy_handle_references(const StateReplayer::Impl &other)
{
	replayed_samplers = other.replayed_samplers;
	replayed_descriptor_set_layouts = other.replayed_descriptor_set_layouts;
	replayed_pipeline_layouts = other.replayed_pipeline_layouts;
	replayed_shader_modules = other.replayed_shader_modules;
	replayed_render_passes = other.replayed_render_passes;
	replayed_compute_pipelines = other.replayed_compute_pipelines;
	replayed_graphics_pipelines = other.replayed_graphics_pipelines;
	replayed_raytracing_pipelines = other.replayed_raytracing_pipelines;
}